

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csoaa.cc
# Opt level: O3

void CSOAA::predict_or_learn<true>(csoaa *c,single_learner *base,example *ec)

{
  uint64_t *puVar1;
  float fVar2;
  wclass *pwVar3;
  wclass *pwVar4;
  float *pfVar5;
  wclass *pwVar6;
  size_t sVar7;
  long lVar8;
  uint uVar9;
  wclass *__begin3;
  wclass *pwVar10;
  features *pfVar11;
  long lVar12;
  unsigned_long uVar13;
  feature_index i;
  float fVar14;
  float local_60;
  uint local_5c;
  
  pwVar3 = (ec->l).cs.costs._begin;
  pwVar4 = (ec->l).cs.costs._end;
  pwVar6 = (ec->l).cs.costs.end_array;
  sVar7 = (ec->l).cs.costs.erase_count;
  pfVar11 = ec->passthrough;
  if (pfVar11 == (features *)0x0) {
    lVar12 = 0;
  }
  else {
    lVar12 = (long)(pfVar11->values)._end - (long)(pfVar11->values)._begin >> 2;
  }
  (ec->l).cs.costs._begin = (wclass *)0x0;
  (ec->l).simple.initial = 0.0;
  if (pwVar4 == pwVar3) {
    if (c->num_classes == 0) {
      local_5c = 1;
    }
    else {
      fVar14 = 3.4028235e+38;
      uVar9 = 1;
      local_5c = 1;
      do {
        puVar1 = &(ec->super_example_predict).ft_offset;
        *puVar1 = *puVar1 + (ulong)(*(int *)(base + 0xe0) * (uVar9 - 1));
        (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
        puVar1 = &(ec->super_example_predict).ft_offset;
        *puVar1 = *puVar1 - (ulong)((uVar9 - 1) * *(int *)(base + 0xe0));
        fVar2 = ec->partial_prediction;
        if ((fVar2 < fVar14) || (uVar9 < local_5c && fVar2 == fVar14)) {
          fVar14 = fVar2;
          local_5c = uVar9;
        }
        if (ec->passthrough != (features *)0x0) {
          features::push_back(ec->passthrough,fVar2,(ulong)uVar9 ^ 0x398d9fda640553);
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 <= c->num_classes);
    }
  }
  else {
    local_5c = 1;
    local_60 = 3.4028235e+38;
    pwVar10 = pwVar3;
    do {
      uVar9 = pwVar10->class_index;
      fVar14 = pwVar10->x;
      ec->weight = (float)(~-(uint)(fVar14 == 3.4028235e+38) & 0x3f800000);
      (ec->l).simple.label = fVar14;
      puVar1 = &(ec->super_example_predict).ft_offset;
      *puVar1 = *puVar1 + (ulong)(*(int *)(base + 0xe0) * (uVar9 - 1));
      (**(code **)(base + 0x28))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
      puVar1 = &(ec->super_example_predict).ft_offset;
      *puVar1 = *puVar1 - (ulong)((uVar9 - 1) * *(int *)(base + 0xe0));
      fVar14 = ec->partial_prediction;
      pwVar10->partial_prediction = fVar14;
      if (fVar14 < local_60) {
LAB_0024d331:
        local_60 = fVar14;
        local_5c = uVar9;
      }
      else if (((fVar14 == local_60) && (!NAN(fVar14) && !NAN(local_60))) && (uVar9 < local_5c))
      goto LAB_0024d331;
      if (ec->passthrough != (features *)0x0) {
        features::push_back(ec->passthrough,fVar14,(ulong)uVar9 ^ 0x398d9fda640553);
      }
      pwVar10 = pwVar10 + 1;
    } while (pwVar10 != pwVar4);
    ec->partial_prediction = local_60;
  }
  pfVar11 = ec->passthrough;
  if (pfVar11 == (features *)0x0) goto LAB_0024d52c;
  pfVar5 = (pfVar11->values)._begin;
  lVar8 = (long)(pfVar11->values)._end - (long)pfVar5 >> 2;
  if (lVar8 == lVar12) {
LAB_0024d50e:
    i = 0x398d9fd8715547;
  }
  else {
    fVar14 = 3.4028235e+38;
    uVar13 = 0;
    do {
      fVar2 = pfVar5[lVar12];
      if ((ec->partial_prediction < fVar2) && (fVar2 < fVar14)) {
        uVar13 = (pfVar11->indicies)._begin[lVar12];
        fVar14 = fVar2;
      }
      lVar12 = lVar12 + 1;
    } while (lVar8 != lVar12);
    if (3.4028235e+38 <= fVar14) goto LAB_0024d50e;
    features::push_back(pfVar11,fVar14 - ec->partial_prediction,0x398d9fdb078feb);
    pfVar11 = ec->passthrough;
    if (pfVar11 == (features *)0x0) goto LAB_0024d52c;
    i = uVar13 + 0x1638ab9 ^ 0x398d9fda640553;
  }
  features::push_back(pfVar11,1.0,i);
LAB_0024d52c:
  (ec->pred).multiclass = local_5c;
  (ec->l).cs.costs._begin = pwVar3;
  (ec->l).cs.costs._end = pwVar4;
  (ec->l).cs.costs.end_array = pwVar6;
  (ec->l).cs.costs.erase_count = sVar7;
  return;
}

Assistant:

void predict_or_learn(csoaa& c, single_learner& base, example& ec)
{
  // cerr << "------------- passthrough" << endl;
  COST_SENSITIVE::label ld = ec.l.cs;
  uint32_t prediction = 1;
  float score = FLT_MAX;
  size_t pt_start = ec.passthrough ? ec.passthrough->size() : 0;
  ec.l.simple = {0., 0., 0.};
  if (ld.costs.size() > 0)
  {
    for (auto& cl : ld.costs)
      inner_loop<is_learn>(base, ec, cl.class_index, cl.x, prediction, score, cl.partial_prediction);
    ec.partial_prediction = score;
  }
  else if (DO_MULTIPREDICT && !is_learn)
  {
    ec.l.simple = {FLT_MAX, 0.f, 0.f};
    base.multipredict(ec, 0, c.num_classes, c.pred, false);
    for (uint32_t i = 1; i <= c.num_classes; i++)
    {
      add_passthrough_feature(ec, i, c.pred[i - 1].scalar);
      if (c.pred[i - 1].scalar < c.pred[prediction - 1].scalar)
        prediction = i;
    }
    ec.partial_prediction = c.pred[prediction - 1].scalar;
  }
  else
  {
    float temp;
    for (uint32_t i = 1; i <= c.num_classes; i++) inner_loop<false>(base, ec, i, FLT_MAX, prediction, score, temp);
  }
  if (ec.passthrough)
  {
    uint64_t second_best = 0;
    float second_best_cost = FLT_MAX;
    for (size_t i = 0; i < ec.passthrough->size() - pt_start; i++)
    {
      float val = ec.passthrough->values[pt_start + i];
      if ((val > ec.partial_prediction) && (val < second_best_cost))
      {
        second_best_cost = val;
        second_best = ec.passthrough->indicies[pt_start + i];
      }
    }
    if (second_best_cost < FLT_MAX)
    {
      float margin = second_best_cost - ec.partial_prediction;
      add_passthrough_feature(ec, constant * 2, margin);
      add_passthrough_feature(ec, constant * 2 + 1 + second_best, 1.);
    }
    else
      add_passthrough_feature(ec, constant * 3, 1.);
  }

  ec.pred.multiclass = prediction;
  ec.l.cs = ld;
}